

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void sendsuboption(connectdata *conn,int option)

{
  undefined2 uVar1;
  undefined2 uVar2;
  SessionHandle *data;
  HTTP *pHVar3;
  ssize_t sVar4;
  uint *puVar5;
  
  if (option == 0x1f) {
    data = conn->data;
    pHVar3 = (data->state).proto.http;
    *(undefined2 *)&pHVar3[0x36].postsize = 0xfaff;
    *(undefined1 *)((long)&pHVar3[0x36].postsize + 2) = 0x1f;
    uVar1 = *(undefined2 *)&pHVar3[0x35].send_buffer;
    uVar2 = *(undefined2 *)((long)&pHVar3[0x35].send_buffer + 2);
    *(char *)((long)&pHVar3[0x36].postsize + 3) = (char)((ushort)uVar1 >> 8);
    *(char *)((long)&pHVar3[0x36].postsize + 4) = (char)uVar1;
    *(char *)((long)&pHVar3[0x36].postsize + 5) = (char)((ushort)uVar2 >> 8);
    *(char *)((long)&pHVar3[0x36].postsize + 6) = (char)uVar2;
    *(undefined2 *)((long)&pHVar3[0x36].postsize + 7) = 0xf0ff;
    *(undefined1 **)&pHVar3[0x39].sending = (undefined1 *)((long)&pHVar3[0x36].postdata + 1);
    pHVar3[0x39].backup.postsize = (curl_off_t)&pHVar3[0x36].postsize;
    printsub(data,0x3e,(uchar *)((long)&pHVar3[0x36].postsize + 2),7);
    sVar4 = send(conn->sock[0],&pHVar3[0x36].postsize,3,0x4000);
    if (sVar4 < 0) {
      puVar5 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar5);
    }
    send_telnet_data(conn,(char *)((long)&pHVar3[0x36].postsize + 3),4);
    sVar4 = send(conn->sock[0],(void *)((long)&pHVar3[0x36].postsize + 7),2,0x4000);
    if (sVar4 < 0) {
      puVar5 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar5);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char*uc1, *uc2;

  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  switch (option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with litte or big endien processors */
    /* Window size must be sent according to the 'network order' */
    x=htons(tn->subopt_wsx);
    y=htons(tn->subopt_wsy);
    uc1 = (unsigned char*)&x;
    uc2 = (unsigned char*)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer+2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer+3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer+7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}